

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O0

Value * __thiscall
wabt::Decompiler::Set<(wabt::ExprType)21>
          (Value *__return_storage_ptr__,Decompiler *this,Value *child,
          VarExpr<(wabt::ExprType)21> *ve)

{
  string_view postfix;
  string *this_00;
  char *in_R8;
  string_view x;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  string_view local_78;
  string_view local_68;
  string local_58;
  string_view local_38;
  VarExpr<(wabt::ExprType)21> *local_28;
  VarExpr<(wabt::ExprType)21> *ve_local;
  Value *child_local;
  Decompiler *this_local;
  
  local_28 = ve;
  ve_local = (VarExpr<(wabt::ExprType)21> *)child;
  child_local = (Value *)this;
  this_local = (Decompiler *)__return_storage_ptr__;
  this_00 = Var::name_abi_cxx11_(&ve->var);
  local_78 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
  local_68 = VarName(this,local_78);
  x._M_str = " = ";
  x._M_len = (size_t)local_68._M_str;
  operator+[abi_cxx11_(&local_58,(wabt *)local_68._M_len,x,in_R8);
  local_38 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_58);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_88,"");
  postfix._M_str = local_88._M_str;
  postfix._M_len = local_88._M_len;
  WrapChild(__return_storage_ptr__,this,child,local_38,postfix,Assign);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

Value Set(Value& child, const VarExpr<T>& ve) {
    return WrapChild(child, VarName(ve.var.name()) + " = ", "",
                     Precedence::Assign);
  }